

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O3

void __thiscall JSONUTF8StringFilter::push_back_u(JSONUTF8StringFilter *this,uint codepoint_)

{
  uint uVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->state != 0) {
    this->is_valid = false;
  }
  uVar1 = this->surpair;
  if ((codepoint_ & 0xfffffc00) == 0xdc00) {
    if (uVar1 == 0) goto LAB_00dca97f;
    append_codepoint(this,codepoint_ + (uVar1 | 0x40) * 0x400 + 0xfc9f2400);
    this->surpair = 0;
  }
  else {
    if ((codepoint_ & 0xfffffc00) == 0xd800) {
      if (uVar1 == 0) {
        this->surpair = codepoint_;
        goto LAB_00dca983;
      }
    }
    else if (uVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        append_codepoint(this,codepoint_);
        return;
      }
      goto LAB_00dca9b6;
    }
LAB_00dca97f:
    this->is_valid = false;
  }
LAB_00dca983:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00dca9b6:
  __stack_chk_fail();
}

Assistant:

void push_back_u(unsigned int codepoint_)
    {
        if (state) // Only accept full codepoints in open state
            is_valid = false;
        if (codepoint_ >= 0xD800 && codepoint_ < 0xDC00) { // First half of surrogate pair
            if (surpair) // Two subsequent surrogate pair openers - fail
                is_valid = false;
            else
                surpair = codepoint_;
        } else if (codepoint_ >= 0xDC00 && codepoint_ < 0xE000) { // Second half of surrogate pair
            if (surpair) { // Open surrogate pair, expect second half
                // Compute code point from UTF-16 surrogate pair
                append_codepoint(0x10000 | ((surpair - 0xD800)<<10) | (codepoint_ - 0xDC00));
                surpair = 0;
            } else // Second half doesn't follow a first half - fail
                is_valid = false;
        } else {
            if (surpair) // First half of surrogate pair not followed by second - fail
                is_valid = false;
            else
                append_codepoint(codepoint_);
        }
    }